

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O2

void __thiscall ipx::IPM::ComputeStartingPoint(IPM *this)

{
  Vector *x_00;
  Model *pMVar1;
  Int j_1;
  ulong uVar2;
  Int j;
  size_t __n;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector zl;
  Vector xl;
  Vector rb;
  Vector zu;
  Vector y;
  Vector xu;
  Vector x;
  double xshift2;
  __type local_40;
  double xshift1;
  
  pMVar1 = this->iterate_->model_;
  __n = (size_t)pMVar1->num_rows_;
  uVar3 = (long)pMVar1->num_cols_ + __n;
  std::valarray<double>::valarray(&x,uVar3);
  std::valarray<double>::valarray(&xl,uVar3);
  std::valarray<double>::valarray(&xu,uVar3);
  std::valarray<double>::valarray(&y,__n);
  std::valarray<double>::valarray(&zl,uVar3);
  std::valarray<double>::valarray(&zu,uVar3);
  std::valarray<double>::valarray(&rb,__n);
  KKTSolver::Factorize(this->kkt_,(Iterate *)0x0,this->info_);
  if ((this->info_->super_ipx_info).errflag == 0) {
    std::valarray<double>::operator=(&rb,&pMVar1->b_);
    uVar2 = 0;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = uVar2;
    }
    x_00 = &pMVar1->c_;
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      dVar5 = (pMVar1->lb_)._M_data[uVar2];
      if (dVar5 <= 0.0) {
        dVar5 = 0.0;
      }
      dVar6 = (pMVar1->ub_)._M_data[uVar2];
      if (dVar5 <= dVar6) {
        dVar6 = dVar5;
      }
      x._M_data[uVar2] = dVar6;
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        ScatterColumn(&pMVar1->AI_,(Int)uVar2,-dVar6,&rb);
      }
    }
    dVar5 = Infnorm(&rb);
    xshift2 = 0.0;
    std::valarray<double>::operator=(&zl,&xshift2);
    KKTSolver::Solve(this->kkt_,&zl,&rb,dVar5 * 0.1,&xl,&y,this->info_);
    if ((this->info_->super_ipx_info).errflag == 0) {
      std::valarray<double>::operator+=(&x,&xl);
      dVar5 = 0.0;
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        dVar6 = x._M_data[uVar3] - (pMVar1->lb_)._M_data[uVar3];
        xl._M_data[uVar3] = dVar6;
        dVar6 = -dVar6;
        if (dVar6 <= dVar5) {
          dVar6 = dVar5;
        }
        dVar5 = (pMVar1->ub_)._M_data[uVar3] - x._M_data[uVar3];
        xu._M_data[uVar3] = dVar5;
        dVar5 = -dVar5;
        if (dVar5 <= dVar6) {
          dVar5 = dVar6;
        }
      }
      xshift1 = dVar5 * 1.5 + 1.0;
      std::valarray<double>::operator+=(&xl,&xshift1);
      std::valarray<double>::operator+=(&xu,&xshift1);
      dVar5 = Twonorm(x_00);
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        xshift2 = 0.0;
        std::valarray<double>::operator=(&rb,&xshift2);
        dVar6 = Infnorm(x_00);
        KKTSolver::Solve(this->kkt_,x_00,&rb,dVar6 * 0.1,&zl,&y,this->info_);
        if ((this->info_->super_ipx_info).errflag != 0) goto LAB_0037c4f9;
        std::valarray<double>::operator=(&zl,x_00);
        MultiplyAdd(&pMVar1->AI_,&y,-1.0,&zl,'T');
        dVar6 = Twonorm(&zl);
        if (dVar6 < dVar5 * 0.05) {
          xshift2 = 0.05;
          local_40 = x_00;
          std::valarray<double>::operator+=
                    (&zl,(_Expr<std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_double,_double>,_double>
                          *)&xshift2);
          xshift2 = 0.95;
          std::valarray<double>::operator*=(&y,&xshift2);
        }
        dVar5 = 0.0;
        for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          dVar6 = zl._M_data[uVar3];
          zl._M_data[uVar3] = 0.0;
          zu._M_data[uVar3] = 0.0;
          dVar8 = ABS((pMVar1->ub_)._M_data[uVar3]);
          if ((ulong)ABS((pMVar1->lb_)._M_data[uVar3]) < 0x7ff0000000000000) {
            if ((ulong)dVar8 < 0x7ff0000000000000) {
              zl._M_data[uVar3] = dVar6 * 0.5;
              dVar7 = dVar6 * -0.5;
              zu._M_data[uVar3] = dVar7;
            }
            else {
              zl._M_data[uVar3] = dVar6;
              dVar7 = zu._M_data[uVar3];
            }
          }
          else {
            dVar7 = 0.0;
            if ((ulong)dVar8 < 0x7ff0000000000000) {
              dVar7 = -dVar6;
              zu._M_data[uVar3] = dVar7;
            }
          }
          dVar6 = -zl._M_data[uVar3];
          if (-zl._M_data[uVar3] <= dVar5) {
            dVar6 = dVar5;
          }
          dVar5 = -dVar7;
          if (-dVar7 <= dVar6) {
            dVar5 = dVar6;
          }
        }
        dVar5 = dVar5 * 1.5 + 1.0;
        for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          if ((ulong)ABS((pMVar1->lb_)._M_data[uVar3]) < 0x7ff0000000000000) {
            zl._M_data[uVar3] = zl._M_data[uVar3] + dVar5;
          }
          if ((ulong)ABS((pMVar1->ub_)._M_data[uVar3]) < 0x7ff0000000000000) {
            zu._M_data[uVar3] = zu._M_data[uVar3] + dVar5;
          }
        }
      }
      else {
        for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          dVar5 = 1.0;
          if (0x7fefffffffffffff < (ulong)ABS((pMVar1->lb_)._M_data[uVar3])) {
            dVar5 = 0.0;
          }
          zl._M_data[uVar3] = dVar5;
          dVar5 = 1.0;
          if (0x7fefffffffffffff < (ulong)ABS((pMVar1->ub_)._M_data[uVar3])) {
            dVar5 = 0.0;
          }
          zu._M_data[uVar3] = dVar5;
        }
      }
      dVar5 = 1.0;
      dVar6 = 1.0;
      dVar8 = 1.0;
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        if ((ulong)ABS((pMVar1->lb_)._M_data[uVar3]) < 0x7ff0000000000000) {
          dVar5 = dVar5 + xl._M_data[uVar3];
          dVar6 = dVar6 + zl._M_data[uVar3];
          dVar8 = dVar8 + xl._M_data[uVar3] * zl._M_data[uVar3];
        }
        if ((ulong)ABS((pMVar1->ub_)._M_data[uVar3]) < 0x7ff0000000000000) {
          dVar5 = dVar5 + xu._M_data[uVar3];
          dVar6 = dVar6 + zu._M_data[uVar3];
          dVar8 = dVar8 + xu._M_data[uVar3] * zu._M_data[uVar3];
        }
      }
      xshift2 = (dVar8 * 0.5) / dVar6;
      std::valarray<double>::operator+=(&xl,&xshift2);
      std::valarray<double>::operator+=(&xu,&xshift2);
      dVar5 = (dVar8 * 0.5) / dVar5;
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        if ((ulong)ABS((pMVar1->lb_)._M_data[uVar3]) < 0x7ff0000000000000) {
          zl._M_data[uVar3] = zl._M_data[uVar3] + dVar5;
        }
        if ((ulong)ABS((pMVar1->ub_)._M_data[uVar3]) < 0x7ff0000000000000) {
          zu._M_data[uVar3] = zu._M_data[uVar3] + dVar5;
        }
      }
      Iterate::Initialize(this->iterate_,&x,&xl,&xu,&y,&zl,&zu);
      dVar5 = Iterate::complementarity(this->iterate_);
      this->best_complementarity_ = dVar5;
    }
  }
LAB_0037c4f9:
  operator_delete(rb._M_data);
  operator_delete(zu._M_data);
  operator_delete(zl._M_data);
  operator_delete(y._M_data);
  operator_delete(xu._M_data);
  operator_delete(xl._M_data);
  operator_delete(x._M_data);
  return;
}

Assistant:

void IPM::ComputeStartingPoint() {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    const Vector& b = model.b();
    const Vector& c = model.c();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    Vector x(n+m), xl(n+m), xu(n+m), y(m), zl(n+m), zu(n+m);
    Vector rb(m);               // workspace

    // Factorize the KKT matrix with the identity matrix in the (1,1) block.
    kkt_->Factorize(nullptr, info_);
    if (info_->errflag)
        return;

    // Set x within its bounds and compute the minimum norm solution dx to
    // AI*dx = (b-AI*x). Then update x := x + dx to obtain a feasible point.
    rb = b;
    for (Int j = 0; j < n+m; j++) {
        double xj = 0.0;
        if (xj < lb[j])
            xj = lb[j];
        if (xj > ub[j])
            xj = ub[j];
        x[j] = xj;
        if (xj != 0.0)
            ScatterColumn(AI, j, -xj, rb);
    }
    double tol = 0.1 * Infnorm(rb);
    zl = 0.0;
    kkt_->Solve(zl, rb, tol, xl, y, info_);
    if (info_->errflag)
        return;
    x += xl;

    // Compute xl, xu and shift to become positive.
    double xinfeas = 0.0;
    for (Int j = 0; j < n+m; j++) {
        xl[j] = x[j]-lb[j];
        xinfeas = std::max(xinfeas, -xl[j]);
        xu[j] = ub[j]-x[j];
        xinfeas = std::max(xinfeas, -xu[j]);
    }
    double xshift1 = 1.0 + 1.5*xinfeas;
    xl += xshift1;
    xu += xshift1;

    const double cnorm = Twonorm(c);
    if (cnorm == 0.0) {
        // Special treatment for zero objective.
        for (Int j = 0; j < n+m; j++) {
            zl[j] = std::isfinite(lb[j]) ? 1.0 : 0.0;
            zu[j] = std::isfinite(ub[j]) ? 1.0 : 0.0;
        }
    } else {
        // Compute y as the least-squares solution to AI'*y=c.
        // Recompute zl = c-AI'*y because the KKT system is solved
        // approximately with a residual in the first block equation.
        rb = 0.0;
        double tol = 0.1 * Infnorm(c);
        kkt_->Solve(c, rb, tol, zl, y, info_);
        if (info_->errflag)
            return;
        zl = c;
        MultiplyAdd(AI, y, -1.0, zl, 'T');

        // When c lies in range(AI'), then the dual slack variables are (close
        // to) zero, and the initial point would be almost complementary but
        // usually not primal feasible. To prevent this from happening, add
        // a fraction of the objective to zl and adjust y. In exact computation
        // this does not affect dual feasibility.
        const double znorm = Twonorm(zl);
        const double rho = 0.05;
        if (znorm < rho*cnorm) {
            zl += rho * c;
            y *= (1.0-rho);
        }

        // Split dual slack solution into zl, zu and shift to become positive.
        double zinfeas = 0.0;
        for (Int j = 0; j < n+m; j++) {
            double zval = zl[j];
            zl[j] = 0.0;
            zu[j] = 0.0;
            if (std::isfinite(lb[j]) && std::isfinite(ub[j])) {
                zl[j] = 0.5*zval;
                zu[j] = -0.5*zval;
            }
            else if (std::isfinite(lb[j]))
                zl[j] = zval;
            else if (std::isfinite(ub[j]))
                zu[j] = -zval;
            zinfeas = std::max(zinfeas, -zl[j]);
            zinfeas = std::max(zinfeas, -zu[j]);
        }
        double zshift1 = 1.0 + 1.5*zinfeas;
        for (Int j = 0; j < n+m; j++) {
            if (std::isfinite(lb[j]))
                zl[j] += zshift1;
            if (std::isfinite(ub[j]))
                zu[j] += zshift1;
        }
    }

    // Level pairwise complementarity products.
    double xsum = 1.0;
    double zsum = 1.0;
    double mu = 1.0;
    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j])) {
            xsum += xl[j];
            zsum += zl[j];
            mu += xl[j]*zl[j];
        }
        if (std::isfinite(ub[j])) {
            xsum += xu[j];
            zsum += zu[j];
            mu += xu[j]*zu[j];
        }
    }
    double xshift2 = 0.5*mu/zsum;
    double zshift2 = 0.5*mu/xsum;
    xl += xshift2;
    xu += xshift2;
    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j]))
            zl[j] += zshift2;
        if (std::isfinite(ub[j]))
            zu[j] += zshift2;
    }
    iterate_->Initialize(x, xl, xu, y, zl, zu);
    best_complementarity_ = iterate_->complementarity();
}